

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  AF_Blue_String AVar3;
  FT_GlyphSlot_conflict pFVar4;
  FT_Vector *pFVar5;
  int iVar6;
  FT_Error FVar7;
  void *buf_;
  AF_StyleMetrics_conflict pAVar8;
  FT_ULong FVar9;
  AF_CJKBlueRec *pAVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  FT_CharMap charmap;
  AF_StyleMetrics_conflict metrics_00;
  FT_Face face_00;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  FT_Vector *pFVar22;
  FT_Pos *pFVar23;
  int iVar24;
  bool bVar25;
  FT_Pos flats [51];
  FT_Pos fills [51];
  ulong local_3c0;
  ulong local_3b8;
  uint local_3a4;
  AF_CJKAxisRec *local_3a0;
  FT_Face local_398;
  FT_Pos *local_390;
  FT_CharMap local_388;
  AF_CJKAxisRec *local_380;
  AF_CJKAxisRec *local_378;
  AF_Blue_StringRec *local_370;
  long alStack_368 [52];
  long alStack_1c8 [51];
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar7 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar7 == 0) {
    face_00 = face;
    local_388 = charmap;
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    buf_ = (void *)hb_buffer_create();
    AVar3 = af_blue_stringsets[AVar2].string;
    if (AVar3 != AF_BLUE_STRING_MAX) {
      face_00 = (FT_Face)(af_blue_stringsets + AVar2);
      local_378 = metrics->axis;
      local_380 = metrics->axis + 1;
      local_398 = face;
      do {
        uVar1 = ((AF_Blue_StringRec *)face_00)->properties;
        local_3a0 = local_378;
        if ((uVar1 & 2) == 0) {
          local_3a0 = local_380;
        }
        cVar11 = af_blue_strings[AVar3];
        local_370 = (AF_Blue_StringRec *)face_00;
        if (cVar11 != '\0') {
          bVar25 = true;
          local_3b8 = 0;
          local_3c0 = 0;
          metrics_00 = (AF_StyleMetrics_conflict)(af_blue_strings + AVar3);
          do {
            while (pAVar8 = (AF_StyleMetrics_conflict)((long)&metrics_00->style_class + 1),
                  cVar11 == ' ') {
              metrics_00 = pAVar8;
              cVar11 = *(char *)&pAVar8->style_class;
            }
            if (cVar11 == '|') {
              bVar25 = false;
            }
            else {
              pAVar8 = (AF_StyleMetrics_conflict)
                       af_shaper_get_cluster((char *)metrics_00,&metrics->root,buf_,&local_3a4);
              if ((((local_3a4 < 2) &&
                   (FVar9 = af_shaper_get_elem(metrics_00,buf_,0,(FT_Long *)0x0,(FT_Long *)0x0),
                   FVar9 != 0)) && (FVar7 = FT_Load_Glyph(face,(FT_UInt)FVar9,1), FVar7 == 0)) &&
                 (pFVar4 = face->glyph, 2 < (pFVar4->outline).n_points)) {
                lVar13 = (long)(pFVar4->outline).n_contours;
                if (lVar13 < 1) {
                  lVar19 = 0;
                }
                else {
                  pFVar5 = (pFVar4->outline).points;
                  local_390 = &pFVar5->y;
                  iVar24 = -1;
                  lVar14 = 0;
                  iVar16 = 0;
                  lVar19 = 0;
                  do {
                    iVar15 = (int)(pFVar4->outline).contours[lVar14];
                    if (iVar16 < iVar15) {
                      lVar21 = (long)iVar16;
                      lVar20 = (iVar15 - lVar21) + 1;
                      if ((uVar1 & 2) == 0) {
                        if ((uVar1 & 1) == 0) {
                          pFVar23 = local_390 + lVar21 * 2;
                          do {
                            lVar21 = *pFVar23;
                            iVar6 = iVar16;
                            if (lVar19 <= *pFVar23 && -1 < iVar24) {
                              lVar21 = lVar19;
                              iVar6 = iVar24;
                            }
                            iVar24 = iVar6;
                            lVar19 = lVar21;
                            iVar16 = iVar16 + 1;
                            pFVar23 = pFVar23 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        else {
                          pFVar23 = local_390 + lVar21 * 2;
                          do {
                            lVar21 = *pFVar23;
                            iVar6 = iVar16;
                            if (*pFVar23 <= lVar19 && -1 < iVar24) {
                              lVar21 = lVar19;
                              iVar6 = iVar24;
                            }
                            iVar24 = iVar6;
                            lVar19 = lVar21;
                            iVar16 = iVar16 + 1;
                            pFVar23 = pFVar23 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                      }
                      else {
                        pFVar22 = pFVar5 + lVar21;
                        if ((uVar1 & 1) == 0) {
                          do {
                            lVar21 = pFVar22->x;
                            iVar6 = iVar16;
                            if (lVar19 <= pFVar22->x && -1 < iVar24) {
                              lVar21 = lVar19;
                              iVar6 = iVar24;
                            }
                            iVar24 = iVar6;
                            lVar19 = lVar21;
                            iVar16 = iVar16 + 1;
                            pFVar22 = pFVar22 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        else {
                          do {
                            lVar21 = pFVar22->x;
                            iVar6 = iVar16;
                            if (pFVar22->x <= lVar19 && -1 < iVar24) {
                              lVar21 = lVar19;
                              iVar6 = iVar24;
                            }
                            iVar24 = iVar6;
                            lVar19 = lVar21;
                            iVar16 = iVar16 + 1;
                            pFVar22 = pFVar22 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                      }
                    }
                    iVar16 = iVar15 + 1;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != lVar13);
                }
                face = local_398;
                if (bVar25) {
                  alStack_1c8[local_3b8] = lVar19;
                  local_3b8 = (ulong)((int)local_3b8 + 1);
                }
                else {
                  alStack_368[local_3c0] = lVar19;
                  bVar25 = false;
                  local_3c0 = (ulong)((int)local_3c0 + 1);
                }
              }
            }
            cVar11 = *(char *)&pAVar8->style_class;
            metrics_00 = pAVar8;
          } while (cVar11 != '\0');
          uVar17 = (uint)local_3c0;
          uVar18 = (uint)local_3b8;
          if (uVar17 != 0 || uVar18 != 0) {
            if (1 < uVar18) {
              uVar12 = 1;
              lVar13 = 0;
              do {
                lVar19 = alStack_1c8[uVar12];
                lVar14 = lVar13;
                do {
                  if (alStack_1c8[lVar14] <= lVar19) break;
                  alStack_1c8[lVar14 + 1] = alStack_1c8[lVar14];
                  alStack_1c8[lVar14] = lVar19;
                  bVar25 = lVar14 != 0;
                  lVar14 = lVar14 + -1;
                } while (bVar25);
                uVar12 = uVar12 + 1;
                lVar13 = lVar13 + 1;
              } while (uVar12 != local_3b8);
            }
            if (uVar17 < 2) {
              pAVar10 = local_3a0->blues + local_3a0->blue_count;
              local_3a0->blue_count = local_3a0->blue_count + 1;
              if (uVar17 != 0) goto LAB_0017c90b;
              lVar13 = alStack_1c8[uVar18 >> 1];
LAB_0017c963:
              (pAVar10->shoot).org = lVar13;
              (pAVar10->ref).org = lVar13;
            }
            else {
              uVar12 = 1;
              lVar13 = 0;
              do {
                lVar19 = alStack_368[uVar12];
                lVar14 = lVar13;
                do {
                  if (alStack_368[lVar14] <= lVar19) break;
                  alStack_368[lVar14 + 1] = alStack_368[lVar14];
                  alStack_368[lVar14] = lVar19;
                  bVar25 = lVar14 != 0;
                  lVar14 = lVar14 + -1;
                } while (bVar25);
                uVar12 = uVar12 + 1;
                lVar13 = lVar13 + 1;
              } while (uVar12 != local_3c0);
              pAVar10 = local_3a0->blues + local_3a0->blue_count;
              local_3a0->blue_count = local_3a0->blue_count + 1;
LAB_0017c90b:
              if (uVar18 == 0) {
                lVar13 = alStack_368[uVar17 >> 1];
                goto LAB_0017c963;
              }
              lVar13 = alStack_1c8[uVar18 >> 1];
              (pAVar10->ref).org = lVar13;
              lVar19 = alStack_368[uVar17 >> 1];
              (pAVar10->shoot).org = lVar19;
              if ((lVar19 != lVar13) && (((lVar13 <= lVar19 ^ (byte)uVar1) & 1) == 0)) {
                lVar13 = (lVar19 + lVar13) / 2;
                goto LAB_0017c963;
              }
            }
            pAVar10->flags = (uint)uVar1 * 2 & 2;
          }
        }
        AVar3 = local_370[1].string;
        face_00 = (FT_Face)(local_370 + 1);
      } while (AVar3 != AF_BLUE_STRING_MAX);
    }
    hb_buffer_destroy(buf_);
    af_cjk_metrics_check_digits(metrics,face_00);
    charmap = local_388;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }